

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecvt.cpp
# Opt level: O2

void test_codecvt_in_n_m(cvt_type *cvt,int n,int m)

{
  int iVar1;
  char *pcVar2;
  cvt_type *pcVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  long lVar8;
  runtime_error *prVar9;
  wchar_t *pwVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  allocator local_2a1;
  char *from_next;
  mbstate_t mb;
  string local_288;
  long local_268;
  mbstate_t mb2;
  wchar_t *to_next;
  wchar_t *local_250;
  long local_248;
  cvt_type *local_240;
  wchar_t buf [128];
  
  mb.__count = 0;
  mb.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  from_next = anon_var_dwarf_389b;
  local_268 = (long)n;
  local_248 = (long)m;
  local_250 = buf + local_248;
  lVar11 = 0;
  pcVar6 = anon_var_dwarf_389b;
  local_240 = cvt;
  do {
    pcVar3 = local_240;
    pcVar2 = from_next;
    if (anon_var_dwarf_389b + 0x1b < from_next) {
      test_counter = test_counter + 1;
      if (lVar11 != 0x3c) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x59);
        poVar7 = std::operator<<(poVar7," wptr == wide_name + wlen");
        std::endl<char,std::char_traits<char>>(poVar7);
        iVar4 = error_counter + 1;
        bVar13 = -1 < error_counter;
        error_counter = iVar4;
        if (bVar13) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)buf,"Error limits reached, stopping unit test",
                     (allocator *)&local_288);
          booster::runtime_error::runtime_error(prVar9,(string *)buf);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if (pcVar2 != anon_var_dwarf_389b + 0x1c) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x5a);
        poVar7 = std::operator<<(poVar7," from == real_end");
        std::endl<char,std::char_traits<char>>(poVar7);
        iVar4 = error_counter + 1;
        bVar13 = -1 < error_counter;
        error_counter = iVar4;
        if (bVar13) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)buf,"Error limits reached, stopping unit test",
                     (allocator *)&local_288);
          booster::runtime_error::runtime_error(prVar9,(string *)buf);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      return;
    }
    pcVar12 = from_next + local_268;
    if (anon_var_dwarf_389b + 0x1c < pcVar12) {
      pcVar12 = anon_var_dwarf_389b + 0x1c;
    }
    if (from_next != pcVar6) {
      pcVar12 = pcVar6;
    }
    mb2 = mb;
    to_next = buf;
    iVar4 = (**(code **)(*(long *)local_240 + 0x20))
                      (local_240,&mb,from_next,pcVar12,&from_next,buf,local_250,&to_next);
    iVar5 = (**(code **)(*(long *)pcVar3 + 0x38))(pcVar3,&mb2,pcVar2,pcVar12,local_248);
    test_counter = test_counter + 1;
    if (mb != mb2) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x40);
      poVar7 = std::operator<<(poVar7," memcmp(&mb,&mb2,sizeof(mb))==0");
      std::endl<char,std::char_traits<char>>(poVar7);
      iVar1 = error_counter + 1;
      bVar13 = -1 < error_counter;
      error_counter = iVar1;
      if (bVar13) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_288,"Error limits reached, stopping unit test",&local_2a1);
        booster::runtime_error::runtime_error(prVar9,&local_288);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    lVar8 = (long)from_next - (long)pcVar2;
    if (lVar8 != iVar5) {
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
      lVar8 = (long)from_next - (long)pcVar2;
    }
    test_counter = test_counter + 1;
    if (lVar8 != iVar5) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x44);
      poVar7 = std::operator<<(poVar7," count == from_next - from");
      std::endl<char,std::char_traits<char>>(poVar7);
      iVar5 = error_counter + 1;
      bVar13 = -1 < error_counter;
      error_counter = iVar5;
      if (bVar13) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_288,"Error limits reached, stopping unit test",&local_2a1);
        booster::runtime_error::runtime_error(prVar9,&local_288);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    pwVar10 = buf;
    if (iVar4 == 1) {
      pcVar6 = pcVar12 + local_268;
      if (anon_var_dwarf_389b + 0x1c < pcVar6) {
        pcVar6 = anon_var_dwarf_389b + 0x1c;
      }
    }
    else {
      test_counter = test_counter + 1;
      pcVar6 = pcVar12;
      if (iVar4 != 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x50);
        poVar7 = std::operator<<(poVar7," r == cvt_type::ok");
        std::endl<char,std::char_traits<char>>(poVar7);
        iVar4 = error_counter + 1;
        bVar13 = -1 < error_counter;
        error_counter = iVar4;
        if (bVar13) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_288,"Error limits reached, stopping unit test",&local_2a1);
          booster::runtime_error::runtime_error(prVar9,&local_288);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    for (; pwVar10 != to_next; pwVar10 = pwVar10 + 1) {
      test_counter = test_counter + 1;
      if (*(wchar_t *)((long)L"𝒞-привет-やあ.txt" + lVar11) != *pwVar10) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x52);
        poVar7 = std::operator<<(poVar7," *wptr == *to");
        std::endl<char,std::char_traits<char>>(poVar7);
        iVar4 = error_counter + 1;
        bVar13 = -1 < error_counter;
        error_counter = iVar4;
        if (bVar13) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_288,"Error limits reached, stopping unit test",&local_2a1);
          booster::runtime_error::runtime_error(prVar9,&local_288);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      lVar11 = lVar11 + 4;
    }
  } while( true );
}

Assistant:

void test_codecvt_in_n_m(cvt_type const &cvt,int n,int m)
{
    wchar_t const *wptr = wide_name;
    int wlen = wcslen(wide_name);
    int u8len = strlen(utf8_name);
    char const *from = utf8_name;
    char const *end = from;
    char const *real_end = utf8_name + u8len;
    char const *from_next = from;
    std::mbstate_t mb=std::mbstate_t();
    while(from_next < real_end) {
        if(from == end) {
            end = from + n;
            if(end > real_end)
                end = real_end;
        }
        
        wchar_t buf[128];
        wchar_t *to = buf;
        wchar_t *to_end = to + m;
        wchar_t *to_next = to;
        
        
        std::mbstate_t mb2 = mb;
        std::codecvt_base::result r = cvt.in(mb,from,end,from_next,to,to_end,to_next);
        //std::cout << "In from_size=" << (end-from) << " from move=" <<  (from_next - from) << " to move= " << to_next - to << " state = " << res(r) << std::endl;
       
        int count = cvt.length(mb2,from,end,to_end - to);
        #ifndef BOOSTER_LOCALE_DO_LENGTH_MBSTATE_CONST
        TEST(memcmp(&mb,&mb2,sizeof(mb))==0);
        if(count != from_next - from) {
            std::cout << count << " " << from_next - from << std::endl;
        }
        TEST(count == from_next - from);
        #else
        TEST(count == to_next - to);
        #endif

        
        if(r == cvt_type::partial) {
            end+=n;
            if(end > real_end)
                end = real_end;
        }
        else
            TEST(r == cvt_type::ok);
        while(to!=to_next) {
            TEST(*wptr == *to);
            wptr++;
            to++;
        }
        to=to_next;
        from = from_next;
    }
    TEST(wptr == wide_name + wlen);
    TEST(from == real_end);
    
}